

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O0

acmod_id_t acmod_set_name2id(acmod_set_t *acmod_set,char *name)

{
  int iVar1;
  acmod_id_t aVar2;
  acmod_id_t left_context;
  acmod_id_t right_context;
  long lVar3;
  size_t sVar4;
  word_posn_t local_1078;
  char local_1074 [4];
  uint32 posn_id;
  char posn [12];
  char *word_posn_map;
  char local_1058 [4];
  acmod_id_t right_id;
  char right [1024];
  char local_c48 [4];
  acmod_id_t left_id;
  char left [1024];
  char local_838 [4];
  acmod_id_t base_id;
  char base [1024];
  int n_assign;
  int n_scan;
  char *tmp;
  char tmp_store [1024];
  uint32 i;
  char *name_local;
  acmod_set_t *acmod_set_local;
  
  posn._4_8_ = anon_var_dwarf_2790;
  strcpy((char *)&tmp,name);
  base._1016_4_ = __isoc99_sscanf(&tmp,"%s%n",local_838,base + 0x3fc);
  lVar3 = (long)&tmp + (long)(int)base._1020_4_;
  if (base._1016_4_ == 1) {
    base._1016_4_ = __isoc99_sscanf(lVar3,"%s%n",local_c48,base + 0x3fc);
    lVar3 = lVar3 + (int)base._1020_4_;
    if (base._1016_4_ == 1) {
      base._1016_4_ = __isoc99_sscanf(lVar3,"%s%n",local_1058,base + 0x3fc);
      if (base._1016_4_ == 1) {
        base._1016_4_ = __isoc99_sscanf(lVar3 + (int)base._1020_4_,"%s%n",local_1074,base + 0x3fc);
        if (base._1016_4_ == 1) {
          aVar2 = acmod_set_name2id(acmod_set,local_838);
          left_context = acmod_set_name2id(acmod_set,local_c48);
          right_context = acmod_set_name2id(acmod_set,local_1058);
          for (local_1078 = WORD_POSN_BEGIN;
              (sVar4 = strlen((char *)posn._4_8_), local_1078 < sVar4 &&
              (local_1074[0] != *(char *)(posn._4_8_ + (ulong)local_1078)));
              local_1078 = local_1078 + WORD_POSN_END) {
          }
          sVar4 = strlen((char *)posn._4_8_);
          if (local_1078 == sVar4) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                    ,0x1ea,"Unknown word position identifier %s\n",local_1074);
            acmod_set_local._4_4_ = 0xffffffff;
          }
          else {
            acmod_set_local._4_4_ =
                 acmod_set_tri2id(acmod_set,aVar2,left_context,right_context,local_1078);
          }
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                  ,0x1db,"Parse error while getting word position of %s\n",name);
          acmod_set_local._4_4_ = 0xffffffff;
        }
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                ,0x1d2,"Parse error while getting right context of %s\n",name);
        acmod_set_local._4_4_ = 0xffffffff;
      }
    }
    else {
      tmp_store[0x3fc] = '\0';
      tmp_store[0x3fd] = '\0';
      tmp_store[0x3fe] = '\0';
      tmp_store[0x3ff] = '\0';
      for (; (uint)tmp_store._1020_4_ < acmod_set->n_ci; tmp_store._1020_4_ = tmp_store._1020_4_ + 1
          ) {
        iVar1 = strcmp(acmod_set->ci[(uint)tmp_store._1020_4_].name,local_838);
        if (iVar1 == 0) {
          aVar2._0_1_ = tmp_store[0x3fc];
          aVar2._1_1_ = tmp_store[0x3fd];
          aVar2._2_1_ = tmp_store[0x3fe];
          aVar2._3_1_ = tmp_store[0x3ff];
          return aVar2;
        }
      }
      acmod_set_local._4_4_ = 0xffffffff;
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
            ,0x1be,"Error parsing acoustic model name %s\n",name);
    acmod_set_local._4_4_ = 0xffffffff;
  }
  return acmod_set_local._4_4_;
}

Assistant:

acmod_id_t
acmod_set_name2id(acmod_set_t *acmod_set,
		  const char *name)
{
    uint32 i;
    char tmp_store[1024];
    char *tmp;
    int n_scan;
    int n_assign;
    char base[1024];
    acmod_id_t base_id;

    char left[1024];
    acmod_id_t left_id;

    char right[1024];
    acmod_id_t right_id;

    char *word_posn_map = WORD_POSN_CHAR_MAP;
    char posn[12];
    uint32 posn_id;

    strcpy(tmp_store, name);

    tmp = tmp_store;

    n_assign = sscanf(tmp, "%s%n", base, &n_scan);
    tmp += n_scan;

    if (n_assign != 1) {
	E_ERROR("Error parsing acoustic model name %s\n", name);
	return NO_ACMOD;
    }

    n_assign = sscanf(tmp, "%s%n", left, &n_scan);
    tmp += n_scan;
    
    if (n_assign != 1) {
	for (i = 0; i < acmod_set->n_ci; i++) {
	    if (strcmp(acmod_set->ci[i].name, base) == 0)
		return i;
	}
    
	return NO_ACMOD;
    }
    else {
	n_assign = sscanf(tmp, "%s%n", right, &n_scan);
	tmp += n_scan;
    
	if (n_assign != 1) {
	    E_ERROR("Parse error while getting right context of %s\n", name);

	    return NO_ACMOD;
	}

	n_assign = sscanf(tmp, "%s%n", posn, &n_scan);
	tmp += n_scan;
    
	if (n_assign != 1) {
	    E_ERROR("Parse error while getting word position of %s\n", name);
	    
	    return NO_ACMOD;
	}

	base_id  = acmod_set_name2id(acmod_set, base);
	left_id  = acmod_set_name2id(acmod_set, left);
	right_id = acmod_set_name2id(acmod_set, right);

	for (posn_id = 0; posn_id < strlen(word_posn_map); posn_id++) {
	    if (posn[0] == word_posn_map[(uint32)posn_id])
		break;
	}

	if (posn_id == strlen(word_posn_map)) {
	    E_ERROR("Unknown word position identifier %s\n", posn);

	    return NO_ACMOD;
	}
	
	return acmod_set_tri2id(acmod_set, base_id, left_id, right_id, (word_posn_t)posn_id);
    }
    
    return NO_ACMOD;
}